

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O2

void InsNew(PProfileList list,PProfile_conflict profile)

{
  PProfile pTVar1;
  PProfile_conflict *old;
  
  while ((pTVar1 = *list, pTVar1 != (PProfile)0x0 && (pTVar1->X <= profile->X))) {
    list = &pTVar1->link;
  }
  profile->link = pTVar1;
  *list = profile;
  return;
}

Assistant:

static void
  InsNew( PProfileList  list,
          PProfile      profile )
  {
    PProfile  *old, current;
    Long       x;


    old     = list;
    current = *old;
    x       = profile->X;

    while ( current )
    {
      if ( x < current->X )
        break;
      old     = &current->link;
      current = *old;
    }

    profile->link = current;
    *old          = profile;
  }